

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_error(char *string,Integer icode)

{
  ulong uVar1;
  long in_RSI;
  char *in_RDI;
  char error_buffer [400];
  int level;
  int in_stack_fffffffffffffe4c;
  char *__s;
  char local_1a8 [408];
  long local_10;
  char *local_8;
  
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = -1;
  }
  __s = local_1a8;
  local_8 = in_RDI;
  uVar1 = pnga_nodeid();
  sprintf(__s,"%d:",uVar1 & 0xffffffff);
  strcat(local_1a8,local_8);
  strcat(local_1a8,":");
  ARMCI_Error(__s,in_stack_fffffffffffffe4c);
  return;
}

Assistant:

void pnga_error(char *string, Integer icode)
{
#ifndef ARMCI
extern void Error();
#endif

#define FOUT stderr
#define ERR_LEN 400
    int level;
    char error_buffer[ERR_LEN];

    /* JAD 02/23/2012 for applications, an exit/error code of 0 indicates
     * success, it is therefore wrong to call pnga_error with a zero value */
    if (icode == 0) {
        icode = -1;
    }

    /* print GA names stack */
    sprintf(error_buffer,"%d:", (int)pnga_nodeid());
    strcat(error_buffer,string);
    strcat(error_buffer,":");
       
#ifdef ARMCI
    ARMCI_Error(error_buffer,(int)icode);
#else
    ga_clean_resources(); 
    if (pnga_nnodes() > 1) Error(error_buffer, icode);
    else{
      fprintf(FOUT,"%s %ld\n",error_buffer,icode);
      perror("system message:");
      fflush(FOUT);
      exit(1);
    }
#endif
}